

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask19_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar1 = in[1];
  *out = uVar1 << 0x13 | uVar2;
  uVar1 = uVar1 >> 0xd;
  out[1] = uVar1;
  uVar1 = in[2] << 6 | uVar1;
  out[1] = uVar1;
  uVar2 = in[3];
  out[1] = uVar2 << 0x19 | uVar1;
  uVar2 = uVar2 >> 7;
  out[2] = uVar2;
  uVar2 = in[4] << 0xc | uVar2;
  out[2] = uVar2;
  uVar1 = in[5];
  out[2] = uVar1 << 0x1f | uVar2;
  uVar1 = uVar1 >> 1;
  out[3] = uVar1;
  uVar2 = in[6];
  out[3] = uVar2 << 0x12 | uVar1;
  uVar2 = uVar2 >> 0xe;
  out[4] = uVar2;
  uVar2 = in[7] << 5 | uVar2;
  out[4] = uVar2;
  uVar1 = in[8];
  out[4] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[5] = uVar1;
  uVar1 = in[9] << 0xb | uVar1;
  out[5] = uVar1;
  uVar2 = in[10];
  out[5] = uVar2 << 0x1e | uVar1;
  uVar2 = uVar2 >> 2;
  out[6] = uVar2;
  uVar1 = in[0xb];
  out[6] = uVar1 << 0x11 | uVar2;
  uVar1 = uVar1 >> 0xf;
  out[7] = uVar1;
  uVar1 = in[0xc] << 4 | uVar1;
  out[7] = uVar1;
  uVar2 = in[0xd];
  out[7] = uVar2 << 0x17 | uVar1;
  uVar2 = uVar2 >> 9;
  out[8] = uVar2;
  uVar2 = in[0xe] << 10 | uVar2;
  out[8] = uVar2;
  uVar1 = in[0xf];
  out[8] = uVar1 << 0x1d | uVar2;
  out[9] = uVar1 >> 3;
  return out + 10;
}

Assistant:

uint32_t *__fastpackwithoutmask19_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (19 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (19 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (19 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (19 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (19 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (19 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (19 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (19 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (19 - 16);
  ++in;

  return out + 1;
}